

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

bool __thiscall DataFilters::StringFilter::isFiltered(StringFilter *this,string *token)

{
  int iVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  long lVar2;
  bool local_8d;
  bool local_69;
  bool isMatch;
  string local_38 [8];
  string input;
  string *token_local;
  StringFilter *this_local;
  
  input.field_2._8_8_ = token;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::operator=(local_38,(string *)input.field_2._8_8_);
  if ((this->_isSensitive & 1U) == 0) {
    __first._M_current = (char *)std::__cxx11::string::begin((string *)input.field_2._8_8_);
    __last._M_current = (char *)std::__cxx11::string::end((string *)input.field_2._8_8_);
    __result._M_current = (char *)std::__cxx11::string::begin(local_38);
    std::
    transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,__last,__result,toupper);
  }
  if ((this->_isExact & 1U) == 0) {
    lVar2 = std::__cxx11::string::find(local_38,(string *)this,0);
    local_69 = lVar2 != -1;
  }
  else {
    iVar1 = std::__cxx11::string::compare(local_38,(string *)this);
    local_69 = iVar1 == 0;
  }
  if ((this->_isAccept & 1U) == 0) {
    local_8d = (bool)(local_69 ^ 0xff);
  }
  else {
    local_8d = local_69;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_8d & 1);
}

Assistant:

bool
        isFiltered(std::string const & token) const
        {

            std::string input;
            
            // Check if filtering is case sensitive
            input = token;
            if (!this->_isSensitive)
            {
                std::transform(token.begin(), token.end(), input.begin(), ::toupper);
            }
            
            // Check if filtering is exact or not
            bool isMatch = false;
            if (this->_isExact)
            {
                isMatch = input.compare(this->_pattern) == 0;
            }
            else
            {
                isMatch = input.find(this->_pattern) != std::string::npos;
            }
            
            return (this->_isAccept ? isMatch : !isMatch);
            
        }